

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[100],char[5],double>
          (Capturer *this,size_t index,char (*value) [100],char (*values) [5],double *values_1)

{
  string local_50;
  double *local_30;
  double *values_local_1;
  char (*values_local) [5];
  char (*value_local) [100];
  size_t index_local;
  Capturer *this_local;
  
  local_30 = values_1;
  values_local_1 = (double *)values;
  values_local = (char (*) [5])value;
  value_local = (char (*) [100])index;
  index_local = (size_t)this;
  Detail::stringify<char[100]>(&local_50,value);
  captureValue(this,index,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  captureValues<char[5],double>
            (this,(size_t)(*value_local + 1),(char (*) [5])values_local_1,local_30);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }